

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O3

OPTIONHANDLER_HANDLE tlsio_openssl_retrieveoptions(CONCRETE_IO_HANDLE handle)

{
  OPTIONHANDLER_RESULT OVar1;
  OPTIONHANDLER_HANDLE handle_00;
  OPTIONHANDLER_HANDLE handle_01;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (handle == (CONCRETE_IO_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (OPTIONHANDLER_HANDLE)0x0;
    }
    pcVar4 = "invalid parameter detected: CONCRETE_IO_HANDLE handle=%p";
    iVar3 = 0x13f;
LAB_00114f50:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
              ,"tlsio_openssl_retrieveoptions",iVar3,1,pcVar4);
    return (OPTIONHANDLER_HANDLE)0x0;
  }
  handle_00 = OptionHandler_Create
                        (tlsio_openssl_CloneOption,tlsio_openssl_DestroyOption,
                         tlsio_openssl_setoption);
  if (handle_00 == (OPTIONHANDLER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (OPTIONHANDLER_HANDLE)0x0;
    }
    pcVar4 = "unable to OptionHandler_Create";
    iVar3 = 0x147;
    goto LAB_00114f50;
  }
  handle_01 = xio_retrieveoptions(*handle);
  if (handle_01 == (OPTIONHANDLER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                ,"tlsio_openssl_retrieveoptions",0x152,1,"unable to retrieve underlying_io options")
      ;
    }
    OptionHandler_Destroy(handle_00);
    return (OPTIONHANDLER_HANDLE)0x0;
  }
  OVar1 = OptionHandler_AddOption(handle_00,"underlying_io_options",handle_01);
  if (OVar1 == OPTIONHANDLER_OK) {
    if ((*(void **)((long)handle + 0x70) == (void *)0x0) ||
       (OVar1 = OptionHandler_AddOption(handle_00,"TrustedCerts",*(void **)((long)handle + 0x70)),
       OVar1 == OPTIONHANDLER_OK)) {
      if ((*(void **)((long)handle + 0x78) == (void *)0x0) ||
         (OVar1 = OptionHandler_AddOption(handle_00,"CipherSuite",*(void **)((long)handle + 0x78)),
         OVar1 == OPTIONHANDLER_OK)) {
        if ((*(void **)((long)handle + 0x80) == (void *)0x0) ||
           (OVar1 = OptionHandler_AddOption
                              (handle_00,"x509certificate",*(void **)((long)handle + 0x80)),
           OVar1 == OPTIONHANDLER_OK)) {
          if ((*(void **)((long)handle + 0x88) == (void *)0x0) ||
             (OVar1 = OptionHandler_AddOption
                                (handle_00,"x509privatekey",*(void **)((long)handle + 0x88)),
             OVar1 == OPTIONHANDLER_OK)) {
            if ((*(int *)((long)handle + 0x90) == 0) ||
               (OVar1 = OptionHandler_AddOption
                                  (handle_00,"tls_version",(void *)((long)handle + 0x90)),
               OVar1 == OPTIONHANDLER_OK)) {
              if ((*(void **)((long)handle + 0xb0) == (void *)0x0) ||
                 (OVar1 = OptionHandler_AddOption
                                    (handle_00,"Engine",*(void **)((long)handle + 0xb0)),
                 OVar1 == OPTIONHANDLER_OK)) {
                if ((*(int *)((long)handle + 200) == 0) ||
                   (OVar1 = OptionHandler_AddOption
                                      (handle_00,"x509PrivatekeyType",(void *)((long)handle + 200)),
                   OVar1 == OPTIONHANDLER_OK)) {
                  if (*(void **)((long)handle + 0x98) == (void *)0x0) goto LAB_00114edf;
                  OVar1 = OptionHandler_AddOption
                                    (handle_00,"tls_validation_callback",
                                     *(void **)((long)handle + 0x98));
                  if (OVar1 != OPTIONHANDLER_OK) {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                                ,"tlsio_openssl_retrieveoptions",0x1a0,1,
                                "unable to save tls_validation_callback option");
                    }
                    OptionHandler_Destroy(handle_00);
                    handle_00 = (OPTIONHANDLER_HANDLE)0x0;
                  }
                  OVar1 = OptionHandler_AddOption
                                    (handle_00,"tls_validation_callback_data",
                                     *(void **)((long)handle + 0xa0));
                  if (OVar1 == OPTIONHANDLER_OK) goto LAB_00114edf;
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    pcVar4 = "unable to save tls_validation_callback_data option";
                    iVar3 = 0x1a7;
                    goto LAB_00114eca;
                  }
                }
                else {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    pcVar4 = "unable to save x509PrivatekeyType option";
                    iVar3 = 400;
                    goto LAB_00114eca;
                  }
                }
              }
              else {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  pcVar4 = "unable to save Engine option";
                  iVar3 = 0x187;
                  goto LAB_00114eca;
                }
              }
            }
            else {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                pcVar4 = "unable to save tls_version option";
                iVar3 = 0x17e;
                goto LAB_00114eca;
              }
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              pcVar4 = "unable to save x509 privatekey option";
              iVar3 = 0x178;
              goto LAB_00114eca;
            }
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar4 = "unable to save x509 certificate option";
            iVar3 = 0x172;
            goto LAB_00114eca;
          }
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar4 = "unable to save CipherSuite option";
          iVar3 = 0x16c;
          goto LAB_00114eca;
        }
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "unable to save TrustedCerts option";
        iVar3 = 0x163;
        goto LAB_00114eca;
      }
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "unable to save underlying_io options";
      iVar3 = 0x15a;
LAB_00114eca:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                ,"tlsio_openssl_retrieveoptions",iVar3,1,pcVar4);
    }
  }
  OptionHandler_Destroy(handle_00);
  handle_00 = (OPTIONHANDLER_HANDLE)0x0;
LAB_00114edf:
  OptionHandler_Destroy(handle_01);
  return handle_00;
}

Assistant:

static OPTIONHANDLER_HANDLE tlsio_openssl_retrieveoptions(CONCRETE_IO_HANDLE handle)
{
    OPTIONHANDLER_HANDLE result;
    if (handle == NULL)
    {
        LogError("invalid parameter detected: CONCRETE_IO_HANDLE handle=%p", handle);
        result = NULL;
    }
    else
    {
        result = OptionHandler_Create(tlsio_openssl_CloneOption, tlsio_openssl_DestroyOption, tlsio_openssl_setoption);
        if (result == NULL)
        {
            LogError("unable to OptionHandler_Create");
            /*return as is*/
        }
        else
        {
            /*this layer cares about the certificates and the x509 credentials*/
            TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)handle;
            OPTIONHANDLER_HANDLE underlying_io_options;

            if ((underlying_io_options = xio_retrieveoptions(tls_io_instance->underlying_io)) == NULL)
            {
                LogError("unable to retrieve underlying_io options");
                OptionHandler_Destroy(result);
                result = NULL;
            }
            else
            {
                if (OptionHandler_AddOption(result, OPTION_UNDERLYING_IO_OPTIONS, underlying_io_options) != OPTIONHANDLER_OK)
                {
                    LogError("unable to save underlying_io options");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else if (
                    (tls_io_instance->certificate != NULL) &&
                    (OptionHandler_AddOption(result, OPTION_TRUSTED_CERT, tls_io_instance->certificate) != OPTIONHANDLER_OK)
                    )
                {
                    LogError("unable to save TrustedCerts option");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else if (
                    (tls_io_instance->cipher_list != NULL) &&
                    (OptionHandler_AddOption(result, OPTION_OPENSSL_CIPHER_SUITE, tls_io_instance->cipher_list) != OPTIONHANDLER_OK)
                    )
                {
                    LogError("unable to save CipherSuite option");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else if (tls_io_instance->x509_certificate != NULL && (OptionHandler_AddOption(result, SU_OPTION_X509_CERT, tls_io_instance->x509_certificate) != OPTIONHANDLER_OK) )
                {
                    LogError("unable to save x509 certificate option");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else if (tls_io_instance->x509_private_key != NULL && (OptionHandler_AddOption(result, SU_OPTION_X509_PRIVATE_KEY, tls_io_instance->x509_private_key) != OPTIONHANDLER_OK) )
                {
                    LogError("unable to save x509 privatekey option");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else if (tls_io_instance->tls_version != 0 && (OptionHandler_AddOption(result, OPTION_TLS_VERSION, &tls_io_instance->tls_version) != OPTIONHANDLER_OK) )
                {
                    LogError("unable to save tls_version option");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else if (
                    (tls_io_instance->engine_id != NULL) &&
                    (OptionHandler_AddOption(result, OPTION_OPENSSL_ENGINE, tls_io_instance->engine_id) != OPTIONHANDLER_OK)
                    )
                {
                    LogError("unable to save Engine option");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else if (
                    (tls_io_instance->x509_private_key_type != KEY_TYPE_DEFAULT) &&
                    (OptionHandler_AddOption(result, OPTION_OPENSSL_PRIVATE_KEY_TYPE, &tls_io_instance->x509_private_key_type))
                    )
                {
                    LogError("unable to save x509PrivatekeyType option");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else if (tls_io_instance->tls_validation_callback != NULL)
                {
#ifdef WIN32
#pragma warning(push)
#pragma warning(disable:4152)
#endif
                    void* ptr = tls_io_instance->tls_validation_callback;
#ifdef WIN32
#pragma warning(pop)
#endif
                    if (OptionHandler_AddOption(result, "tls_validation_callback", (const char*)ptr) != OPTIONHANDLER_OK)
                    {
                        LogError("unable to save tls_validation_callback option");
                        OptionHandler_Destroy(result);
                        result = NULL;
                    }

                    if (OptionHandler_AddOption(result, "tls_validation_callback_data", (const char*)tls_io_instance->tls_validation_callback_data) != OPTIONHANDLER_OK)
                    {
                        LogError("unable to save tls_validation_callback_data option");
                        OptionHandler_Destroy(result);
                        result = NULL;
                    }
                }
                else
                {
                    /*all is fine, all interesting options have been saved*/
                    /*return as is*/
                }

                // Must destroy since OptionHandler_AddOption creates a copy of it. 
                OptionHandler_Destroy(underlying_io_options); 
            }
        }
    }
    return result;
}